

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

void __thiscall QResource::QResource(QResource *this,QString *file,QLocale *locale)

{
  QResourcePrivate *this_00;
  
  this_00 = (QResourcePrivate *)operator_new(0x90);
  QResourcePrivate::QResourcePrivate(this_00,this);
  (this->d_ptr).d = this_00;
  QString::operator=(&this_00->fileName,file);
  QLocale::operator=((QLocale *)this_00,locale);
  return;
}

Assistant:

QResource::QResource(const QString &file, const QLocale &locale) : d_ptr(new QResourcePrivate(this))
{
    Q_D(QResource);
    d->fileName = file;
    d->locale = locale;
}